

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargePropagator::initialize(FluctuatingChargePropagator *this)

{
  RealType rootEpsilon;
  SimInfo *info;
  FluctuatingChargeParameters *pFVar1;
  pointer pcVar2;
  FluctuatingChargeConstraints *this_00;
  Impl *impl;
  OptimizationFactory *this_01;
  OptimizationMethod *pOVar3;
  size_t maxIterations;
  NoConstraint noConstraint;
  DynamicVector<double,_std::allocator<double>_> initCoords;
  string chargeOptMethod;
  Problem problem;
  EndCriteria endCriteria;
  FluctuatingChargeObjectiveFunction flucQobjf;
  Constraint local_110;
  double local_100;
  undefined **local_f8;
  DynamicVector<double,_std::allocator<double>_> local_f0;
  string local_d8;
  FluctuatingChargeObjectiveFunction *local_b8;
  Constraint *local_b0;
  vector<double,_std::allocator<double>_> local_a8 [2];
  undefined ***local_78;
  EndCriteria local_70;
  FluctuatingChargeObjectiveFunction local_48;
  
  info = this->info_;
  if ((info->usesFluctuatingCharges_ == true) && (0 < info->nGlobalFluctuatingCharges_)) {
    this->hasFlucQ_ = true;
    this_00 = (FluctuatingChargeConstraints *)operator_new(0x88);
    FluctuatingChargeConstraints::FluctuatingChargeConstraints(this_00,info);
    this->fqConstraints_ = this_00;
    FluctuatingChargeConstraints::setConstrainRegions
              (this_00,(bool)(this->fqParams_->ConstrainRegions).super_ParameterBase.field_0x2b);
  }
  if ((this->hasFlucQ_ == true) &&
     ((this->fqParams_->DoInitialOptimization).super_ParameterBase.field_0x2b == '\x01')) {
    FluctuatingChargeObjectiveFunction::FluctuatingChargeObjectiveFunction
              (&local_48,this->info_,this->forceMan_,this->fqConstraints_);
    FluctuatingChargeObjectiveFunction::setInitialCoords(&local_f0,&local_48);
    impl = (Impl *)operator_new(8);
    impl->_vptr_Impl = (_func_int **)&PTR__Impl_003014f0;
    QuantLib::Constraint::Constraint(&local_110,impl);
    local_110._vptr_Constraint = (_func_int **)&PTR__Constraint_003014a8;
    local_f8 = &PTR__StatusFunction_00301540;
    local_b8 = &local_48;
    local_b0 = &local_110;
    std::vector<double,_std::allocator<double>_>::vector(local_a8,&local_f0.data_);
    local_78 = &local_f8;
    pFVar1 = this->fqParams_;
    maxIterations = (size_t)*(int *)&(pFVar1->MaxIterations).super_ParameterBase.field_0x2c;
    rootEpsilon = (pFVar1->Tolerance).data_;
    local_100 = (pFVar1->InitialStepSize).data_;
    QuantLib::EndCriteria::EndCriteria
              (&local_70,maxIterations,maxIterations,rootEpsilon,rootEpsilon,rootEpsilon);
    pcVar2 = (this->fqParams_->ChargeOptimizationMethod).data_._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,
               pcVar2 + (this->fqParams_->ChargeOptimizationMethod).data_._M_string_length);
    this_01 = OptimizationFactory::getInstance();
    pOVar3 = OptimizationFactory::createOptimization(this_01,&local_d8,this->info_);
    (*pOVar3->_vptr_OptimizationMethod[2])(local_100,pOVar3,&local_b8,&local_70);
    (*pOVar3->_vptr_OptimizationMethod[1])(pOVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_110._vptr_Constraint = (_func_int **)&PTR__Constraint_00301590;
    if (local_110.impl_ != (Impl *)0x0) {
      (*(local_110.impl_)->_vptr_Impl[1])();
    }
    if (local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  this->initialized_ = true;
  return;
}

Assistant:

void FluctuatingChargePropagator::initialize() {
    if (info_->usesFluctuatingCharges()) {
      if (info_->getNFluctuatingCharges() > 0) {
        hasFlucQ_      = true;
        fqConstraints_ = new FluctuatingChargeConstraints(info_);
        fqConstraints_->setConstrainRegions(fqParams_->getConstrainRegions());
      }
    }

    if (!hasFlucQ_) {
      initialized_ = true;
      return;
    }

    // SimInfo::MoleculeIterator i;
    // Molecule::FluctuatingChargeIterator  j;
    // Molecule* mol;
    // Atom* atom;
    //
    // For single-minima flucq, this ensures a net neutral system, but
    // for multiple minima, this is no longer the right thing to do:
    //
    // for (mol = info_->beginMolecule(i); mol != NULL;
    //      mol = info_->nextMolecule(i)) {
    //   for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
    //        atom = mol->nextFluctuatingCharge(j)) {
    //     atom->setFlucQPos(0.0);
    //     atom->setFlucQVel(0.0);
    //   }
    // }

    if (fqParams_->getDoInitialOptimization()) {
      FluctuatingChargeObjectiveFunction flucQobjf(info_, forceMan_,
                                                   fqConstraints_);

      DynamicVector<RealType> initCoords = flucQobjf.setInitialCoords();

      NoConstraint noConstraint {};
      NoStatus noStatus {};

      Problem problem(flucQobjf, noConstraint, noStatus, initCoords);

      int maxIter              = fqParams_->getMaxIterations();
      RealType tolerance       = fqParams_->getTolerance();
      RealType initialStepSize = fqParams_->getInitialStepSize();

      EndCriteria endCriteria(maxIter, maxIter, tolerance, tolerance,
                              tolerance);
      std::string chargeOptMethod = fqParams_->getChargeOptimizationMethod();
      OptimizationMethod* minim =
          OptimizationFactory::getInstance().createOptimization(chargeOptMethod,
                                                                info_);

      minim->minimize(problem, endCriteria, initialStepSize);

      delete minim;
    }

    initialized_ = true;
  }